

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fits_hcompress.c
# Opt level: O0

void output_nybble(char *outfile,int bits)

{
  int bits_local;
  char *outfile_local;
  
  buffer2 = buffer2 << 4 | bits & 0xfU;
  bits_to_go2 = bits_to_go2 + -4;
  if (bits_to_go2 < 1) {
    outfile[noutchar] = (char)(buffer2 >> (-(char)bits_to_go2 & 0x1fU));
    if (noutchar < noutmax) {
      noutchar = noutchar + 1;
    }
    bits_to_go2 = bits_to_go2 + 8;
  }
  bitcount = bitcount + 4;
  return;
}

Assistant:

static void
output_nybble(char *outfile, int bits)
{
	/*
	 * insert 4 bits at end of buffer
	 */
	buffer2 = (buffer2<<4) | ( bits & 15 );
	bits_to_go2 -= 4;
	if (bits_to_go2 <= 0) {
		/*
		 * buffer2 full, put out top 8 bits
		 */

	        outfile[noutchar] = ((buffer2>>(-bits_to_go2)) & 0xff);

		if (noutchar < noutmax) noutchar++;
		
		bits_to_go2 += 8;
	}
	bitcount += 4;
}